

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O3

edata_t * duckdb_je_ecache_alloc_grow
                    (tsdn_t *tsdn,pac_t *pac,ehooks_t *ehooks,ecache_t *ecache,edata_t *expand_edata
                    ,size_t size,size_t alignment,_Bool zero,_Bool guarded)

{
  int8_t *piVar1;
  uint64_t *puVar2;
  witness_t **ppwVar3;
  atomic_zu_t *paVar4;
  size_t sVar5;
  edata_t *size_00;
  ehooks_t *ehooks_00;
  _Bool _Var6;
  int iVar7;
  extent_split_interior_result_t eVar8;
  edata_t *peVar9;
  ecache_t *peVar10;
  tsd_t *ptVar11;
  uint uVar12;
  void *pvVar13;
  ulong uVar14;
  edata_cache_t *edata_cache;
  undefined1 growing_retained;
  edata_t **trail_00;
  uint uVar15;
  size_t in_stack_ffffffffffffff68;
  _Bool commit;
  _Bool committed;
  _Bool zeroed;
  tsd_t *local_88;
  ecache_t *local_80;
  ehooks_t *local_78;
  edata_t *local_70;
  edata_t *edata;
  pthread_mutex_t *local_60;
  ulong local_58;
  edata_t *local_50;
  edata_t *to_leak;
  edata_t *trail;
  edata_t *lead;
  
  commit = true;
  local_60 = (pthread_mutex_t *)((long)&(pac->grow_mtx).field_0 + 0x48);
  local_88 = &tsdn->tsd;
  local_70 = (edata_t *)size;
  iVar7 = pthread_mutex_trylock(local_60);
  if (iVar7 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&pac->grow_mtx);
    (pac->grow_mtx).field_0.field_0.locked.repr = true;
  }
  puVar2 = &(pac->grow_mtx).field_0.field_0.prof_data.n_lock_ops;
  *puVar2 = *puVar2 + 1;
  if (&((pac->grow_mtx).field_0.field_0.prof_data.prev_owner)->tsd != local_88) {
    *(tsd_t **)((long)&(pac->grow_mtx).field_0 + 0x30) = local_88;
    ppwVar3 = &(pac->grow_mtx).field_0.witness.link.qre_prev;
    *ppwVar3 = (witness_t *)((long)&(*ppwVar3)->name + 1);
  }
  uVar14 = (ulong)zero;
  peVar9 = extent_recycle((tsdn_t *)local_88,pac,ehooks,&pac->ecache_retained,expand_edata,
                          (size_t)local_70,alignment,zero,&commit,true,guarded);
  if (peVar9 == (edata_t *)0x0) {
    local_78 = ehooks;
    local_58 = uVar14;
    if (((expand_edata == (edata_t *)0x0 && !guarded) && duckdb_je_opt_retain == true) &&
       (peVar9 = (edata_t *)
                 ((long)&local_70[-0x20].e_bits + (alignment + 0xfff & 0xfffffffffffff000)),
       local_70 <= peVar9)) {
      uVar12 = (pac->exp_grow).next;
      iVar7 = 1;
      do {
        size_00 = (edata_t *)duckdb_je_sz_pind2sz_tab[uVar12];
        if (peVar9 <= size_00) {
          edata = duckdb_je_edata_cache_get((tsdn_t *)local_88,pac->edata_cache);
          if (edata == (edata_t *)0x0) break;
          zeroed = false;
          committed = false;
          peVar10 = (ecache_t *)(local_78->ptr).repr;
          if (peVar10 == (ecache_t *)&duckdb_je_ehooks_default_extent_hooks) {
            peVar10 = (ecache_t *)
                      duckdb_je_ehooks_default_alloc_impl
                                ((tsdn_t *)local_88,(void *)0x0,(size_t)size_00,0x1000,&zeroed,
                                 &committed,local_78->ind);
          }
          else {
            ptVar11 = local_88;
            if ((local_88 == (tsd_t *)0x0) &&
               (local_80 = peVar10, ptVar11 = (tsd_t *)__tls_get_addr(&PTR_02494380),
               peVar10 = local_80, (ptVar11->state).repr != '\0')) {
              ptVar11 = duckdb_je_tsd_fetch_slow(ptVar11,false);
              peVar10 = local_80;
            }
            ptVar11->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level =
                 ptVar11->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level +
                 '\x01';
            if ((ptVar11->state).repr == '\0') {
              local_80 = peVar10;
              duckdb_je_tsd_slow_update(ptVar11);
              peVar10 = local_80;
            }
            peVar10 = (ecache_t *)
                      (*(extent_alloc_t *)(peVar10->mtx).field_0.field_0.prof_data.tot_wait_time.ns)
                                ((extent_hooks_t *)peVar10,(void *)0x0,(size_t)size_00,0x1000,
                                 &zeroed,&committed,local_78->ind);
            ptVar11 = local_88;
            if ((local_88 == (tsd_t *)0x0) &&
               (local_80 = peVar10, ptVar11 = (tsd_t *)__tls_get_addr(&PTR_02494380),
               peVar10 = local_80, (ptVar11->state).repr != '\0')) {
              ptVar11 = duckdb_je_tsd_fetch_slow(ptVar11,false);
              peVar10 = local_80;
            }
            piVar1 = &ptVar11->
                      cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == '\0') {
              local_80 = peVar10;
              duckdb_je_tsd_slow_update(ptVar11);
              peVar10 = local_80;
            }
          }
          peVar9 = edata;
          ptVar11 = local_88;
          if (peVar10 == (ecache_t *)0x0) {
            edata_cache = pac->edata_cache;
          }
          else {
            uVar12 = (pac->ecache_retained).ind;
            LOCK();
            paVar4 = &pac->duckdb_je_extent_sn_next;
            sVar5 = paVar4->repr;
            paVar4->repr = paVar4->repr + 1;
            UNLOCK();
            edata->e_addr = peVar10;
            (edata->field_2).e_size_esn =
                 (ulong)((uint)(edata->field_2).e_size_esn & 0xfff) | (ulong)size_00;
            edata->e_sn = sVar5;
            edata->e_bits =
                 (ulong)committed << 0xd | (ulong)zeroed << 0xf | (ulong)(uVar12 & 0xf0000fff) |
                 edata->e_bits & 0xffffeffff0000000 | 0x10000e800000;
            local_80 = &pac->ecache_retained;
            _Var6 = duckdb_je_emap_register_boundary((tsdn_t *)local_88,pac->emap,edata,0xe8,false);
            ehooks_00 = local_78;
            if (!_Var6) {
              if ((peVar9->e_bits & 0x2000) != 0) {
                commit = true;
              }
              to_leak = (edata_t *)0x0;
              local_50 = (edata_t *)0x0;
              trail_00 = &trail;
              eVar8 = extent_split_interior
                                ((tsdn_t *)local_88,pac,local_78,&edata,&lead,trail_00,&to_leak,
                                 &local_50,local_70,alignment,in_stack_ffffffffffffff68);
              peVar10 = local_80;
              growing_retained = SUB81(trail_00,0);
              if (eVar8 == extent_split_interior_ok) {
                if (lead != (edata_t *)0x0) {
                  duckdb_je_extent_record((tsdn_t *)local_88,pac,ehooks_00,local_80,lead);
                }
                if (trail != (edata_t *)0x0) {
                  duckdb_je_extent_record((tsdn_t *)local_88,pac,ehooks_00,peVar10,trail);
                }
                peVar9 = edata;
                if (((commit != true) || ((edata->e_bits & 0x2000) != 0)) ||
                   (_Var6 = extent_commit_impl((tsdn_t *)local_88,local_78,edata,0,
                                               (edata->field_2).e_size_esn & 0xfffffffffffff000,
                                               (_Bool)growing_retained), !_Var6)) {
                  uVar15 = iVar7 + (pac->exp_grow).next;
                  uVar12 = (pac->exp_grow).limit;
                  if (uVar12 <= uVar15) {
                    uVar15 = uVar12;
                  }
                  (pac->exp_grow).next = uVar15;
                  (pac->grow_mtx).field_0.field_0.locked.repr = false;
                  pthread_mutex_unlock(local_60);
                  if (zero) {
                    if ((edata->e_bits & 0x8000) != 0) {
                      return edata;
                    }
                    pvVar13 = (void *)((ulong)edata->e_addr & 0xfffffffffffff000);
                    uVar14 = (edata->field_2).e_size_esn & 0xfffffffffffff000;
                    if ((extent_hooks_t *)(local_78->ptr).repr ==
                        &duckdb_je_ehooks_default_extent_hooks) {
                      duckdb_je_ehooks_default_zero_impl(pvVar13,uVar14);
                    }
                    else {
                      switchD_012e3010::default(pvVar13,0,uVar14);
                    }
                  }
                  if (edata != (edata_t *)0x0) {
                    return edata;
                  }
                  goto LAB_01d71179;
                }
                duckdb_je_extent_record((tsdn_t *)local_88,pac,local_78,peVar10,peVar9);
              }
              else {
                if (local_50 != (edata_t *)0x0) {
                  duckdb_je_extent_record((tsdn_t *)local_88,pac,ehooks_00,local_80,local_50);
                }
                peVar9 = to_leak;
                ptVar11 = local_88;
                if (to_leak != (edata_t *)0x0) {
                  duckdb_je_emap_deregister_boundary((tsdn_t *)local_88,pac->emap,to_leak);
                  extents_abandon_vm((tsdn_t *)ptVar11,pac,local_78,peVar10,peVar9,
                                     (_Bool)growing_retained);
                }
              }
              break;
            }
            edata_cache = pac->edata_cache;
          }
          duckdb_je_edata_cache_put((tsdn_t *)ptVar11,edata_cache,peVar9);
          break;
        }
        uVar12 = uVar12 + 1;
        iVar7 = iVar7 + 1;
      } while (uVar12 < 0xc6);
    }
    (pac->grow_mtx).field_0.field_0.locked.repr = false;
    pthread_mutex_unlock(local_60);
LAB_01d71179:
    if ((expand_edata != (edata_t *)0x0 & duckdb_je_opt_retain) == 0 && !guarded) {
      if (expand_edata == (edata_t *)0x0) {
        pvVar13 = (void *)0x0;
      }
      else {
        pvVar13 = (void *)(((expand_edata->field_2).e_size_esn & 0xfffffffffffff000) +
                          ((ulong)expand_edata->e_addr & 0xfffffffffffff000));
      }
      peVar9 = duckdb_je_extent_alloc_wrapper
                         ((tsdn_t *)local_88,pac,local_78,pvVar13,(size_t)local_70,alignment,
                          SUB81(local_58,0),&commit,false);
    }
    else {
      peVar9 = (edata_t *)0x0;
    }
  }
  else {
    (pac->grow_mtx).field_0.field_0.locked.repr = false;
    pthread_mutex_unlock(local_60);
  }
  return peVar9;
}

Assistant:

edata_t *
ecache_alloc_grow(tsdn_t *tsdn, pac_t *pac, ehooks_t *ehooks, ecache_t *ecache,
    edata_t *expand_edata, size_t size, size_t alignment, bool zero,
    bool guarded) {
	assert(size != 0);
	assert(alignment != 0);
	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE, 0);

	bool commit = true;
	edata_t *edata = extent_alloc_retained(tsdn, pac, ehooks, expand_edata,
	    size, alignment, zero, &commit, guarded);
	if (edata == NULL) {
		if (opt_retain && expand_edata != NULL) {
			/*
			 * When retain is enabled and trying to expand, we do
			 * not attempt extent_alloc_wrapper which does mmap that
			 * is very unlikely to succeed (unless it happens to be
			 * at the end).
			 */
			return NULL;
		}
		if (guarded) {
			/*
			 * Means no cached guarded extents available (and no
			 * grow_retained was attempted).  The pac_alloc flow
			 * will alloc regular extents to make new guarded ones.
			 */
			return NULL;
		}
		void *new_addr = (expand_edata == NULL) ? NULL :
		    edata_past_get(expand_edata);
		edata = extent_alloc_wrapper(tsdn, pac, ehooks, new_addr,
		    size, alignment, zero, &commit,
		    /* growing_retained */ false);
	}

	assert(edata == NULL || edata_pai_get(edata) == EXTENT_PAI_PAC);
	return edata;
}